

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

void call_return(ch_context *context)

{
  ch_primitive *pcVar1;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 aVar2;
  undefined4 uVar3;
  uint uVar4;
  ch_primitive *pcVar5;
  ch_upvalue *pcVar6;
  
  pcVar5 = ch_stack_get(&context->stack,
                        (context->call_stack).calls[(context->call_stack).size - 1].stack_addr);
  pcVar6 = context->open_upvalues;
  while ((pcVar6 != (ch_upvalue *)0x0 && (pcVar1 = pcVar6->value, pcVar5 <= pcVar1))) {
    uVar3 = *(undefined4 *)&pcVar1->field_0x4;
    aVar2 = pcVar1->field_1;
    (pcVar6->closed).type = pcVar1->type;
    *(undefined4 *)&(pcVar6->closed).field_0x4 = uVar3;
    (pcVar6->closed).field_1 = aVar2;
    pcVar6->value = &pcVar6->closed;
    pcVar6 = pcVar6->next;
    context->open_upvalues = pcVar6;
  }
  uVar4 = (context->call_stack).size - 1;
  (context->call_stack).size = uVar4;
  context->pcurrent = (context->call_stack).calls[uVar4].return_addr;
  ch_stack_seekto(&context->stack,(context->call_stack).calls[uVar4].stack_addr);
  return;
}

Assistant:

static void call_return(ch_context *context) {
  ch_primitive* stack_pos = ch_stack_get(&context->stack, CURRENT_CALL(context).stack_addr);
  close_upvalues(context, stack_pos);

  ch_call *call = &context->call_stack.calls[--context->call_stack.size];
  context->pcurrent = call->return_addr;

  // TODO check result of call
  ch_stack_seekto(&context->stack, call->stack_addr);
}